

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secret_storage.cpp
# Opt level: O3

SecretMatch __thiscall
duckdb::CatalogSetSecretStorage::LookupSecret
          (CatalogSetSecretStorage *this,string *path,string *type,
          optional_ptr<duckdb::CatalogTransaction,_true> transaction)

{
  CatalogTransaction transaction_00;
  pointer this_00;
  int64_t extraout_RDX;
  int64_t extraout_RDX_00;
  int64_t extraout_RDX_01;
  int64_t extraout_RDX_02;
  int64_t iVar1;
  optional_ptr<duckdb::CatalogTransaction,_true> in_R8;
  SecretMatch SVar2;
  SecretMatch local_88;
  _Any_data local_78;
  code *local_68;
  code *local_60;
  CatalogTransaction local_58;
  
  local_88.secret_entry.
  super_unique_ptr<duckdb::SecretEntry,_std::default_delete<duckdb::SecretEntry>_>._M_t.
  super___uniq_ptr_impl<duckdb::SecretEntry,_std::default_delete<duckdb::SecretEntry>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::SecretEntry_*,_std::default_delete<duckdb::SecretEntry>_>.
  super__Head_base<0UL,_duckdb::SecretEntry_*,_false>._M_head_impl =
       (unique_ptr<duckdb::SecretEntry,_std::default_delete<duckdb::SecretEntry>_>)
       (__uniq_ptr_data<duckdb::SecretEntry,_std::default_delete<duckdb::SecretEntry>,_true,_true>)
       0x0;
  local_88.score = -0x8000000000000000;
  local_78._8_8_ = 0;
  local_78._M_unused._M_object = operator_new(0x20);
  *(CatalogTransaction **)local_78._M_unused._0_8_ = transaction.ptr;
  *(SecretMatch **)((long)local_78._M_unused._0_8_ + 8) = &local_88;
  *(string **)((long)local_78._M_unused._0_8_ + 0x10) = type;
  *(string **)((long)local_78._M_unused._0_8_ + 0x18) = path;
  local_60 = ::std::
             _Function_handler<void_(duckdb::CatalogEntry_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/main/secret/secret_storage.cpp:106:55)>
             ::_M_invoke;
  local_68 = ::std::
             _Function_handler<void_(duckdb::CatalogEntry_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/main/secret/secret_storage.cpp:106:55)>
             ::_M_manager;
  this_00 = unique_ptr<duckdb::CatalogSet,_std::default_delete<duckdb::CatalogSet>,_true>::
            operator->((unique_ptr<duckdb::CatalogSet,_std::default_delete<duckdb::CatalogSet>,_true>
                        *)((long)&path[1].field_2 + 8));
  GetTransactionOrDefault(&local_58,(CatalogSetSecretStorage *)path,in_R8);
  transaction_00.context.ptr = local_58.context.ptr;
  transaction_00.db.ptr = local_58.db.ptr;
  transaction_00.transaction.ptr = local_58.transaction.ptr;
  transaction_00.transaction_id = local_58.transaction_id;
  transaction_00.start_time = local_58.start_time;
  CatalogSet::Scan(this_00,transaction_00,(function<void_(duckdb::CatalogEntry_&)> *)&local_78);
  if (local_88.secret_entry.
      super_unique_ptr<duckdb::SecretEntry,_std::default_delete<duckdb::SecretEntry>_>._M_t.
      super___uniq_ptr_impl<duckdb::SecretEntry,_std::default_delete<duckdb::SecretEntry>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::SecretEntry_*,_std::default_delete<duckdb::SecretEntry>_>.
      super__Head_base<0UL,_duckdb::SecretEntry_*,_false>._M_head_impl ==
      (__uniq_ptr_data<duckdb::SecretEntry,_std::default_delete<duckdb::SecretEntry>,_true,_true>)
      0x0) {
    (this->super_SecretStorage)._vptr_SecretStorage = (_func_int **)0x0;
    (this->super_SecretStorage).storage_name._M_dataplus._M_p = (pointer)0x8000000000000000;
    iVar1 = extraout_RDX;
  }
  else {
    SecretMatch::SecretMatch((SecretMatch *)this,&local_88);
    iVar1 = extraout_RDX_00;
  }
  if (local_68 != (code *)0x0) {
    (*local_68)(&local_78,&local_78,__destroy_functor);
    iVar1 = extraout_RDX_01;
  }
  if (local_88.secret_entry.
      super_unique_ptr<duckdb::SecretEntry,_std::default_delete<duckdb::SecretEntry>_>._M_t.
      super___uniq_ptr_impl<duckdb::SecretEntry,_std::default_delete<duckdb::SecretEntry>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::SecretEntry_*,_std::default_delete<duckdb::SecretEntry>_>.
      super__Head_base<0UL,_duckdb::SecretEntry_*,_false>._M_head_impl !=
      (__uniq_ptr_data<duckdb::SecretEntry,_std::default_delete<duckdb::SecretEntry>,_true,_true>)
      0x0) {
    ::std::default_delete<duckdb::SecretEntry>::operator()
              ((default_delete<duckdb::SecretEntry> *)&local_88,
               (SecretEntry *)
               local_88.secret_entry.
               super_unique_ptr<duckdb::SecretEntry,_std::default_delete<duckdb::SecretEntry>_>._M_t
               .
               super___uniq_ptr_impl<duckdb::SecretEntry,_std::default_delete<duckdb::SecretEntry>_>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb::SecretEntry_*,_std::default_delete<duckdb::SecretEntry>_>
               .super__Head_base<0UL,_duckdb::SecretEntry_*,_false>._M_head_impl);
    iVar1 = extraout_RDX_02;
  }
  SVar2.score = iVar1;
  SVar2.secret_entry.
  super_unique_ptr<duckdb::SecretEntry,_std::default_delete<duckdb::SecretEntry>_>._M_t.
  super___uniq_ptr_impl<duckdb::SecretEntry,_std::default_delete<duckdb::SecretEntry>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::SecretEntry_*,_std::default_delete<duckdb::SecretEntry>_>.
  super__Head_base<0UL,_duckdb::SecretEntry_*,_false>._M_head_impl =
       (unique_ptr<duckdb::SecretEntry,_std::default_delete<duckdb::SecretEntry>_>)
       (unique_ptr<duckdb::SecretEntry,_std::default_delete<duckdb::SecretEntry>_>)this;
  return SVar2;
}

Assistant:

SecretMatch CatalogSetSecretStorage::LookupSecret(const string &path, const string &type,
                                                  optional_ptr<CatalogTransaction> transaction) {
	auto best_match = SecretMatch();

	const std::function<void(CatalogEntry &)> callback = [&](CatalogEntry &entry) {
		auto &cast_entry = entry.Cast<SecretCatalogEntry>();
		if (StringUtil::CIEquals(cast_entry.secret->secret->GetType(), type)) {
			best_match = SelectBestMatch(*cast_entry.secret, path, tie_break_offset, best_match);
		}
	};
	secrets->Scan(GetTransactionOrDefault(transaction), callback);

	if (best_match.HasMatch()) {
		return best_match;
	}

	return SecretMatch();
}